

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dh_candidate_index_impl.h
# Opt level: O3

void __thiscall
dh_candidate_index::CandidateIndex::lookup
          (CandidateIndex *this,
          vector<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>
          *histogram_collection,
          vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *join_candidates,
          int il_size,double distance_threshold)

{
  pointer ppVar1;
  int iVar2;
  iterator iVar3;
  pointer ppVar4;
  long lVar5;
  pointer piVar6;
  iterator __end2;
  __node_base *p_Var7;
  iterator __begin2;
  pointer __args;
  int *piVar8;
  int current_tree_id;
  int pre_cand_id;
  vector<int,_std::allocator<int>_> pre_candidates;
  vector<int,_std::allocator<int>_> intersection_cnt;
  vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  il_index;
  int local_b0;
  int local_ac;
  int *local_a8;
  iterator iStack_a0;
  int *local_98;
  vector<int,_std::allocator<int>_> local_88;
  pointer local_70;
  CandidateIndex *local_68;
  pointer local_60;
  vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *local_58;
  double local_50;
  vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  local_48;
  
  local_68 = this;
  local_58 = (vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)join_candidates;
  local_50 = distance_threshold;
  std::
  vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  ::vector(&local_48,(long)(il_size + 1),(allocator_type *)&local_88);
  local_b0 = 0;
  std::vector<int,_std::allocator<int>_>::vector
            (&local_88,
             (long)(histogram_collection->
                   super__Vector_base<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(histogram_collection->
                   super__Vector_base<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 6,(allocator_type *)&local_a8);
  ppVar4 = (histogram_collection->
           super__Vector_base<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_70 = (histogram_collection->
             super__Vector_base<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar4 != local_70) {
    do {
      local_a8 = (int *)0x0;
      iStack_a0._M_current = (int *)0x0;
      local_98 = (int *)0x0;
      p_Var7 = &(ppVar4->second)._M_h._M_before_begin;
      local_60 = ppVar4;
      while (iVar3._M_current = iStack_a0._M_current, p_Var7 = p_Var7->_M_nxt,
            p_Var7 != (__node_base *)0x0) {
        lVar5 = (long)(int)*(size_type *)(p_Var7 + 1);
        __args = local_48.
                 super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar5].
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        ppVar1 = local_48.
                 super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar5].
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        piVar6 = local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (__args != ppVar1) {
          do {
            iVar2 = *(int *)((long)(p_Var7 + 1) + 4);
            if (__args->second < *(int *)((long)(p_Var7 + 1) + 4)) {
              iVar2 = __args->second;
            }
            if ((piVar6[__args->first] == 0) && (iVar2 != 0)) {
              if (iStack_a0._M_current == local_98) {
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          ((vector<int,std::allocator<int>> *)&local_a8,iStack_a0,&__args->first);
                piVar6 = local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start;
              }
              else {
                *iStack_a0._M_current = __args->first;
                iStack_a0._M_current = iStack_a0._M_current + 1;
              }
            }
            piVar6[__args->first] = piVar6[__args->first] + iVar2;
            __args = __args + 1;
          } while (__args != ppVar1);
          lVar5 = (long)(int)*(size_type *)(p_Var7 + 1);
        }
        std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::emplace_back<int&,int&>
                  ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
                   (local_48.
                    super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + lVar5),&local_b0,
                   (int *)((long)(p_Var7 + 1) + 4));
      }
      local_68->pre_candidates_ =
           local_68->pre_candidates_ + ((long)iStack_a0._M_current - (long)local_a8 >> 2);
      piVar6 = local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (piVar8 = local_a8; iVar3._M_current != piVar8; piVar8 = piVar8 + 1) {
        local_ac = *piVar8;
        lVar5 = (long)local_ac;
        ppVar4 = (histogram_collection->
                 super__Vector_base<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if ((double)((ppVar4[lVar5].first + ppVar4[local_b0].first + piVar6[lVar5] * -2) / 3) <=
            local_50) {
          std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
          emplace_back<int&,int&>(local_58,&local_b0,&local_ac);
          lVar5 = (long)local_ac;
          piVar6 = local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
        }
        piVar6[lVar5] = 0;
      }
      local_b0 = local_b0 + 1;
      if (local_a8 != (int *)0x0) {
        operator_delete(local_a8,(long)local_98 - (long)local_a8);
      }
      ppVar4 = local_60 + 1;
    } while (ppVar4 != local_70);
  }
  if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  ::~vector(&local_48);
  return;
}

Assistant:

void CandidateIndex::lookup(
    std::vector<std::pair<int, std::unordered_map<int, int>>>& histogram_collection,
    std::vector<std::pair<int, int>>& join_candidates,
    const int il_size,
    const double distance_threshold) {
  // inverted list index
  std::vector<std::vector<std::pair<int, int>>> il_index(il_size+1);
  // id of the tree that is currently processed
  int current_tree_id = 0;
  // overlap count for all trees
  std::vector<int> intersection_cnt(histogram_collection.size());
  // store ids of all tree with an overlap, called pre candidates

  // iterate through all histograms in the given collection
  for (auto& histogram: histogram_collection) {
    std::vector<int> pre_candidates;
    for (auto& element: histogram.second) {
      for (auto& il_entry: il_index[element.first]) {
        int intersection = std::min(element.second, il_entry.second);
        if(intersection_cnt[il_entry.first] == 0 && intersection != 0)
          pre_candidates.push_back(il_entry.first);
        intersection_cnt[il_entry.first] += intersection;
      }

      il_index[element.first].emplace_back(current_tree_id, element.second);
    }

    // count the number of pre canidates
    pre_candidates_ += pre_candidates.size();

    // verify all pre candidates
    for(int pre_cand_id: pre_candidates) {
      if((histogram_collection[current_tree_id].first + histogram_collection[pre_cand_id].first - 
          (2 * intersection_cnt[pre_cand_id])) / 3 <= distance_threshold)
        join_candidates.emplace_back(current_tree_id, pre_cand_id);
      // reset intersection counter
      intersection_cnt[pre_cand_id] = 0;
    }
    current_tree_id++;
  }
}